

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runtimes.cpp
# Opt level: O0

size_t fibonacci(size_t N,Runtime *rt)

{
  size_t sVar1;
  Worker *in_RSI;
  Node *in_RDI;
  size_t res2;
  size_t res1;
  Executor *in_stack_ffffffffffffffe0;
  Node *local_8;
  
  local_8 = in_RDI;
  if ((Node *)0x1 < in_RDI) {
    tf::Runtime::silent_async<fibonacci(unsigned_long,tf::Runtime&)::__0>
              ((Runtime *)&stack0xffffffffffffffe0,(anon_class_16_2_d707333a *)in_RDI);
    sVar1 = fibonacci((size_t)in_RSI,(Runtime *)in_stack_ffffffffffffffe0);
    tf::Runtime::corun((Runtime *)in_RDI);
    local_8 = (Node *)((long)&(in_stack_ffffffffffffffe0->_taskflows_mutex).super___mutex_base.
                              _M_mutex + sVar1);
  }
  return (size_t)local_8;
}

Assistant:

size_t fibonacci(size_t N, tf::Runtime& rt) {

  if (N < 2) {
    return N; 
  }
  
  size_t res1, res2;

  rt.silent_async([N, &res1](tf::Runtime& rt1){ res1 = fibonacci(N-1, rt1); });
  
  // tail optimization
  res2 = fibonacci(N-2, rt);

  // use corun to avoid blocking the worker from waiting the two children tasks to finish
  rt.corun();

  return res1 + res2;
}